

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O3

void prsgdot(prscxdef *ctx,prsndef *n,int cnt)

{
  undefined2 uVar1;
  ushort uVar2;
  ushort uVar3;
  prsndef *n_00;
  prsndef *n_01;
  prsndef *ppVar4;
  emtcxdef *peVar5;
  bool bVar6;
  bool bVar7;
  uchar uVar8;
  emtcxdef **ppeVar9;
  uchar uVar10;
  uint16_t tmp_1;
  
  n_00 = (n->prsnv).prsnvn[0];
  n_01 = (n->prsnv).prsnvn[1];
  if (n_00->prsnnlf == 1) {
    if (n_00->prsntyp != 0x20) goto switchD_0011fc22_caseD_3;
    ppVar4 = (n_00->prsnv).prsnvn[0];
    prsdef(ctx,&(ppVar4->prsnv).prsnvt,7);
    uVar1 = *(undefined2 *)((long)&ppVar4->prsnv + 0x42);
    uVar8 = '.';
    uVar10 = '/';
    bVar7 = false;
  }
  else {
    if ((n_00->prsnnlf == 0) && ((n_00->prsnv).prsnvt.toktyp == 0x38)) {
      switch((n_00->prsnv).prsnvt.toksym.tokstyp) {
      case '\x02':
      case '\a':
        bVar7 = true;
        uVar8 = '>';
        uVar10 = '(';
        uVar1 = 0;
        bVar6 = true;
        goto LAB_0011fc8e;
      default:
        goto switchD_0011fc22_caseD_3;
      case '\x05':
        uVar8 = '<';
        uVar10 = 'R';
        if ((ctx->prscxflg & 0x40) != 0) {
          errlogf(ctx->prscxerr,"TADS",0x158);
        }
        break;
      case '\t':
        uVar8 = 'G';
        uVar10 = '\'';
      }
    }
    else {
switchD_0011fc22_caseD_3:
      prsgexp(ctx,n_00);
      uVar8 = '\x12';
      uVar10 = '(';
    }
    bVar7 = true;
    uVar1 = 0;
  }
  bVar6 = false;
LAB_0011fc8e:
  if ((n_01->prsnnlf == 0) && ((n_01->prsnv).prsnvt.toktyp == 0x55)) {
    uVar2 = (n_01->prsnv).prsnvt.tokofs;
    ppeVar9 = &ctx->prscxemt;
    emtres(ctx->prscxemt,1);
    peVar5 = ctx->prscxemt;
    uVar3 = peVar5->emtcxofs;
    peVar5->emtcxofs = uVar3 + 1;
    peVar5->emtcxptr[uVar3] = uVar8;
    emtres(ctx->prscxemt,1);
    peVar5 = ctx->prscxemt;
    uVar3 = peVar5->emtcxofs;
    peVar5->emtcxofs = uVar3 + 1;
    peVar5->emtcxptr[uVar3] = (uchar)cnt;
    if (bVar6) {
      emtres(*ppeVar9,2);
      *(undefined2 *)((*ppeVar9)->emtcxptr + (*ppeVar9)->emtcxofs) =
           *(undefined2 *)((long)&n_00->prsnv + 0x42);
      (*ppeVar9)->emtcxofs = (*ppeVar9)->emtcxofs + 2;
    }
    emtres(*ppeVar9,2);
    *(ushort *)((*ppeVar9)->emtcxptr + (*ppeVar9)->emtcxofs) = uVar2;
    (*ppeVar9)->emtcxofs = (*ppeVar9)->emtcxofs + 2;
  }
  else {
    if (bVar6) {
      prsgexp(ctx,n_00);
    }
    prsgexp(ctx,n_01);
    emtres(ctx->prscxemt,1);
    peVar5 = ctx->prscxemt;
    uVar3 = peVar5->emtcxofs;
    peVar5->emtcxofs = uVar3 + 1;
    peVar5->emtcxptr[uVar3] = uVar10;
    emtres(ctx->prscxemt,1);
    peVar5 = ctx->prscxemt;
    uVar3 = peVar5->emtcxofs;
    peVar5->emtcxofs = uVar3 + 1;
    peVar5->emtcxptr[uVar3] = (uchar)cnt;
  }
  if (!bVar7) {
    ppeVar9 = &ctx->prscxemt;
    emtres(*ppeVar9,2);
    *(undefined2 *)((*ppeVar9)->emtcxptr + (*ppeVar9)->emtcxofs) = uVar1;
    (*ppeVar9)->emtcxofs = (*ppeVar9)->emtcxofs + 2;
  }
  return;
}

Assistant:

static void prsgdot(prscxdef *ctx, prsndef *n, int cnt)
{
    prsndef *n0 = n->prsnv.prsnvn[0];
    prsndef *n1 = n->prsnv.prsnvn[1];
    int      inh;                                 /* flag: "inherited.prop" */
    int      slf;                                      /* flag: "self.prop" */
    int      objflg;           /* flag: LHS of dot is constant object value */
    int      exp_inh;                  /* flag: "inherited superclass.prop" */
    uchar    reg_op;                /* operator to use for regular property */
    uchar    ptr_op;                /* operator to use for property pointer */
    objnum   exp_inh_obj;     /* explicit superclass object to inherit from */

    /* presume we'll have a regular object expression for the LHS */
    inh = exp_inh = slf = objflg = FALSE;

    /* set up the default opcodes for ordinary object expressions */
    reg_op = OPCGETP;
    ptr_op = OPCPTRGETP;

    /* check for special left-hand-side values */
    if (n0->prsnnlf == 0 && n0->prsnv.prsnvt.toktyp == TOKTSYMBOL)
    {
        switch(n0->prsnv.prsnvt.toksym.tokstyp)
        {
        case TOKSTINHERIT:
            inh = TRUE;
            reg_op = OPCINHERIT;
            ptr_op = OPCPTRINH;
            break;
            
        case TOKSTSELF:
            if (ctx->prscxflg & PRSCXFFUNC) errlog(ctx->prscxerr, ERR_NOSELF);
            slf = TRUE;
            reg_op = OPCGETPSELF;
            ptr_op = OPCGETPPTRSELF;
            break;
            
        case TOKSTOBJ:
        case TOKSTFWDOBJ:
            objflg = TRUE;
            reg_op = OPCGETPOBJ;
            break;
        }
    }
    else if (n0->prsnnlf == 1 && n0->prsntyp == TOKTEXPINH)
    {
        tokdef *sc_tok;
        
        /* 
         *   explicit superclass inheritance - this is inheritance, but
         *   with an explicit superclass value 
         */
        inh = TRUE;
        exp_inh = TRUE;
        reg_op = OPCEXPINH;
        ptr_op = OPCEXPINHPTR;

        /* get the explicit superclass subnode */
        sc_tok = &n0->prsnv.prsnvn[0]->prsnv.prsnvt;

        /* make sure the superclass is an object */
        prsdef(ctx, sc_tok, TOKSTFWDOBJ);

        /* get the explicit superclass - it's the subnode */
        exp_inh_obj = sc_tok->toksym.toksval;
    }

    /* 
     *   push object whose property we're getting unless inheriting or
     *   getting a property of 'self' or of a fixed object (in which cases
     *   the object is implicit in the opcode, rather than being on the
     *   stack) 
     */
    if (!inh && !slf && !objflg)
        prsgexp(ctx, n0);

    if (n1->prsnnlf == 0
        && n1->prsnv.prsnvt.toktyp == TOKTPOUND)
    {
        /* RHS is a property symbol - do a simple GETP (or INHERIT) */
        prpnum prop = n1->prsnv.prsnvt.tokofs;

        /* 
         *   emit the opcode and argument count - use the regular
         *   (non-pointer) opcode, since we have a regular property value 
         */
        emtop(ctx->prscxemt, reg_op);
        emtbyte(ctx->prscxemt, cnt);

        /* if we are encoding the object in the instruction, emit it now */
        if (objflg)
            emtint2(ctx->prscxemt, n0->prsnv.prsnvt.toksym.toksval);

        /* add the property value */
        emtint2(ctx->prscxemt, prop);

        /* 
         *   if this is an "inherited" with an explicit superclass, add
         *   the explicit superclass value 
         */
        if (exp_inh)
            emtint2(ctx->prscxemt, exp_inh_obj);
    }
    else
    {
        /* 
         *   evaluate the LHS unconditionally, even if it's just a fixed
         *   object, since we have no special instruction that encodes an
         *   object value in a pointer property evaluation 
         */
        if (objflg)
            prsgexp(ctx, n0);

        /* RHS is an expression - evaluate it */
        prsgexp(ctx, n1);

        /* 
         *   emit the opcode and the byte count - use the pointer opcode,
         *   since we have a property pointer 
         */
        emtop(ctx->prscxemt, ptr_op);
        emtbyte(ctx->prscxemt, cnt);

        /* 
         *   if this is an "inherited" with an explicit superclass, add
         *   the explicit superclass value 
         */
        if (exp_inh)
            emtint2(ctx->prscxemt, exp_inh_obj);
    }
}